

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# schema_compile.c
# Opt level: O1

LY_ERR lys_compile_ext(lysc_ctx *ctx,lysp_ext_instance *extp,lysc_ext_instance *ext,void *parent)

{
  char **str_p;
  void **ppvVar1;
  ly_stmt lVar2;
  lysp_ext *plVar3;
  lysc_ext_instance *plVar4;
  lysp_ext_instance *plVar5;
  bool bVar6;
  bool bVar7;
  LY_ERR LVar8;
  lysc_ext *plVar9;
  long *plVar10;
  lysp_ext_instance *plVar11;
  lysp_ext_instance *plVar12;
  lyplg_ext *plVar13;
  void *pvVar14;
  long lVar15;
  lys_module *parent_module;
  
  str_p = &ext->argument;
  LVar8 = lydict_dup(ctx->ctx,extp->argument,str_p);
  if (LVar8 != LY_SUCCESS) goto LAB_00141159;
  ext->module = ctx->cur_mod;
  ext->parent = parent;
  lVar2 = extp->parent_stmt;
  ext->parent_stmt = lVar2;
  ext->parent_stmt_index = extp->parent_stmt_index;
  LVar8 = LY_SUCCESS;
  if ((short)lVar2 == 0) {
    parent_module = (lys_module *)0x0;
  }
  else {
    parent_module = *(lys_module **)((long)parent + 8);
  }
  lysc_update_path(ctx,parent_module,"{extension}");
  lysc_update_path(ctx,(lys_module *)0x0,extp->name);
  plVar3 = extp->def;
  if (plVar3->compiled == (lysc_ext *)0x0) {
    lysc_update_path(ctx,(lys_module *)0x0,"{extension}");
    lysc_update_path(ctx,(lys_module *)0x0,plVar3->name);
    plVar9 = (lysc_ext *)calloc(1,0x30);
    plVar3->compiled = plVar9;
    ext->def = plVar9;
    LVar8 = lydict_dup(ctx->ctx,plVar3->name,(char **)plVar9);
    if ((LVar8 != LY_SUCCESS) ||
       (LVar8 = lydict_dup(ctx->ctx,plVar3->argname,&ext->def->argname), LVar8 != LY_SUCCESS))
    goto LAB_00141137;
    LVar8 = lysp_ext_find_definition(ctx->ctx,extp,&ext->def->module,(lysp_ext **)0x0);
    if (LVar8 != LY_SUCCESS) goto LAB_00141137;
    plVar11 = plVar3->exts;
    LVar8 = LY_SUCCESS;
    if (plVar11 == (lysp_ext_instance *)0x0) {
LAB_00141505:
      lysc_update_path(ctx,(lys_module *)0x0,(char *)0x0);
      lysc_update_path(ctx,(lys_module *)0x0,(char *)0x0);
      plVar13 = &extp->record->plugin;
      if (extp->record == (lyplg_ext_record *)0x0) {
        plVar13 = (lyplg_ext *)0x0;
      }
      ext->def->plugin = plVar13;
      goto LAB_001410aa;
    }
    plVar4 = ext->def->exts;
    if (plVar4 == (lysc_ext_instance *)0x0) {
      pvVar14 = (void *)0x0;
      plVar10 = (long *)calloc(1,(long)plVar11[-1].exts * 0x48 + 8);
    }
    else {
      pvVar14 = plVar4[-1].compiled;
      plVar10 = (long *)realloc(&plVar4[-1].compiled,
                                ((long)&(plVar11[-1].exts)->name +
                                (long)plVar4[-1].compiled + (long)pvVar14) * 0x48 + 8);
    }
    if (plVar10 == (long *)0x0) {
      LVar8 = LY_EMEM;
      ly_log(ctx->ctx,LY_LLERR,LY_EMEM,"Memory allocation failed (%s()).");
      bVar6 = false;
      bVar7 = true;
    }
    else {
      ext->def->exts = (lysc_ext_instance *)(plVar10 + 1);
      plVar4 = ext->def->exts;
      bVar6 = true;
      if (plVar4 == (lysc_ext_instance *)0x0) {
        LVar8 = LY_SUCCESS;
        bVar7 = false;
      }
      else {
        LVar8 = LY_SUCCESS;
        if (plVar3->exts == (lysp_ext_instance *)0x0) {
          plVar11 = (lysp_ext_instance *)0x0;
        }
        else {
          plVar11 = plVar3->exts[-1].exts;
        }
        memset(plVar4 + *plVar10,0,((long)&plVar11->name + (long)pvVar14) * 0x48);
        bVar7 = false;
        bVar6 = true;
      }
    }
    if (bVar6) {
      lVar15 = 0;
      plVar11 = (lysp_ext_instance *)0x0;
      while( true ) {
        plVar5 = plVar3->exts;
        if (plVar5 == (lysp_ext_instance *)0x0) {
          plVar12 = (lysp_ext_instance *)0x0;
        }
        else {
          plVar12 = plVar5[-1].exts;
        }
        if (plVar12 <= plVar11) break;
        plVar9 = ext->def;
        plVar4 = plVar9->exts;
        pvVar14 = plVar4[-1].compiled;
        plVar4[-1].compiled = (void *)((long)pvVar14 + 1);
        LVar8 = lys_compile_ext(ctx,(lysp_ext_instance *)((long)&plVar5->name + lVar15),
                                plVar4 + (-(ulong)(plVar4 == (lysc_ext_instance *)0x0) |
                                         (ulong)pvVar14),plVar9);
        if (LVar8 != LY_SUCCESS) {
          if (LVar8 != LY_ENOT) {
            bVar7 = true;
            goto LAB_001414f4;
          }
          ppvVar1 = &ext->def->exts[-1].compiled;
          *ppvVar1 = (void *)((long)*ppvVar1 + -1);
        }
        plVar11 = (lysp_ext_instance *)((long)&plVar11->name + 1);
        lVar15 = lVar15 + 0x70;
        LVar8 = LY_SUCCESS;
      }
      bVar7 = false;
    }
LAB_001414f4:
    if (bVar7) goto LAB_00141137;
    if (!bVar7) goto LAB_00141505;
  }
  else {
LAB_001410aa:
    ext->def = plVar3->compiled;
LAB_00141137:
    if (LVar8 != LY_SUCCESS) {
      lysc_update_path(ctx,(lys_module *)0x0,(char *)0x0);
      lysc_update_path(ctx,(lys_module *)0x0,(char *)0x0);
    }
  }
  if (LVar8 == LY_SUCCESS) {
    plVar11 = extp->exts;
    if (plVar11 == (lysp_ext_instance *)0x0) {
      LVar8 = LY_SUCCESS;
    }
    else {
      plVar4 = ext->exts;
      if (plVar4 == (lysc_ext_instance *)0x0) {
        pvVar14 = (void *)0x0;
        plVar10 = (long *)calloc(1,(long)plVar11[-1].exts * 0x48 + 8);
      }
      else {
        pvVar14 = plVar4[-1].compiled;
        plVar10 = (long *)realloc(&plVar4[-1].compiled,
                                  ((long)&(plVar11[-1].exts)->name +
                                  (long)plVar4[-1].compiled + (long)pvVar14) * 0x48 + 8);
      }
      if (plVar10 == (long *)0x0) {
        bVar6 = false;
        LVar8 = LY_EMEM;
        ly_log(ctx->ctx,LY_LLERR,LY_EMEM,"Memory allocation failed (%s()).","lys_compile_ext");
        bVar7 = true;
      }
      else {
        ext->exts = (lysc_ext_instance *)(plVar10 + 1);
        LVar8 = LY_SUCCESS;
        if (extp->exts == (lysp_ext_instance *)0x0) {
          plVar11 = (lysp_ext_instance *)0x0;
        }
        else {
          plVar11 = extp->exts[-1].exts;
        }
        memset(plVar10 + *plVar10 * 9 + 1,0,((long)&plVar11->name + (long)pvVar14) * 0x48);
        bVar6 = true;
        bVar7 = false;
      }
      if (bVar6) {
        lVar15 = 0;
        plVar11 = (lysp_ext_instance *)0x0;
        while( true ) {
          plVar5 = extp->exts;
          if (plVar5 == (lysp_ext_instance *)0x0) {
            plVar12 = (lysp_ext_instance *)0x0;
          }
          else {
            plVar12 = plVar5[-1].exts;
          }
          if (plVar12 <= plVar11) break;
          plVar4 = ext->exts;
          pvVar14 = plVar4[-1].compiled;
          plVar4[-1].compiled = (void *)((long)pvVar14 + 1);
          LVar8 = lys_compile_ext(ctx,(lysp_ext_instance *)((long)&plVar5->name + lVar15),
                                  plVar4 + (-(ulong)(plVar4 == (lysc_ext_instance *)0x0) |
                                           (ulong)pvVar14),ext);
          if (LVar8 != LY_SUCCESS) {
            if (LVar8 != LY_ENOT) {
              bVar7 = true;
              goto LAB_001412eb;
            }
            ppvVar1 = &ext->exts[-1].compiled;
            *ppvVar1 = (void *)((long)*ppvVar1 + -1);
          }
          plVar11 = (lysp_ext_instance *)((long)&plVar11->name + 1);
          lVar15 = lVar15 + 0x70;
          LVar8 = LY_SUCCESS;
        }
        bVar7 = false;
      }
LAB_001412eb:
      if (bVar7) goto LAB_00141159;
      if (bVar7) {
        return LVar8;
      }
    }
    plVar13 = ext->def->plugin;
    if ((plVar13 != (lyplg_ext *)0x0) && (plVar13->compile != (lyplg_ext_compile_clb)0x0)) {
      if (*str_p != (char *)0x0) {
        lysc_update_path(ctx,ext->module,*str_p);
      }
      LVar8 = (*ext->def->plugin->compile)(ctx,extp,ext);
      if (LVar8 == LY_ENOT) {
        lysc_ext_instance_free(&ctx->free_ctx,ext);
      }
      if (*str_p != (char *)0x0) {
        lysc_update_path(ctx,(lys_module *)0x0,(char *)0x0);
      }
    }
  }
LAB_00141159:
  lysc_update_path(ctx,(lys_module *)0x0,(char *)0x0);
  lysc_update_path(ctx,(lys_module *)0x0,(char *)0x0);
  return LVar8;
}

Assistant:

LY_ERR
lys_compile_ext(struct lysc_ctx *ctx, struct lysp_ext_instance *extp, struct lysc_ext_instance *ext, void *parent)
{
    LY_ERR ret = LY_SUCCESS;

    DUP_STRING_GOTO(ctx->ctx, extp->argument, ext->argument, ret, cleanup);
    ext->module = ctx->cur_mod;
    ext->parent = parent;
    ext->parent_stmt = extp->parent_stmt;
    ext->parent_stmt_index = extp->parent_stmt_index;

    lysc_update_path(ctx, (ext->parent_stmt & LY_STMT_NODE_MASK) ? ((struct lysc_node *)ext->parent)->module : NULL,
            "{extension}");
    lysc_update_path(ctx, NULL, extp->name);

    /* compile extension if not already */
    LY_CHECK_GOTO(ret = lys_compile_extension(ctx, extp, &ext->def), cleanup);

    /* compile nested extensions */
    COMPILE_EXTS_GOTO(ctx, extp->exts, ext->exts, ext, ret, cleanup);

    /* compile this extension */
    if (ext->def->plugin && ext->def->plugin->compile) {
        if (ext->argument) {
            lysc_update_path(ctx, ext->module, ext->argument);
        }
        ret = ext->def->plugin->compile(ctx, extp, ext);
        if (ret == LY_ENOT) {
            lysc_ext_instance_free(&ctx->free_ctx, ext);
        }
        if (ext->argument) {
            lysc_update_path(ctx, NULL, NULL);
        }
        LY_CHECK_GOTO(ret, cleanup);
    }

cleanup:
    lysc_update_path(ctx, NULL, NULL);
    lysc_update_path(ctx, NULL, NULL);
    return ret;
}